

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<VkSpecParser::Command>::erase
          (QGenericArrayOps<VkSpecParser::Command> *this,Command *b,qsizetype n)

{
  Command *pCVar1;
  long in_RDX;
  Command *in_RSI;
  long in_RDI;
  Command *end;
  Command *e;
  Command *in_stack_ffffffffffffffb8;
  Command *in_stack_ffffffffffffffc0;
  Command *local_20;
  
  local_20 = in_RSI + in_RDX;
  pCVar1 = QArrayDataPointer<VkSpecParser::Command>::begin
                     ((QArrayDataPointer<VkSpecParser::Command> *)0x117563);
  if ((in_RSI == pCVar1) &&
     (in_stack_ffffffffffffffc0 = local_20,
     pCVar1 = QArrayDataPointer<VkSpecParser::Command>::end
                        ((QArrayDataPointer<VkSpecParser::Command> *)local_20),
     in_stack_ffffffffffffffc0 != pCVar1)) {
    *(Command **)(in_RDI + 8) = local_20;
  }
  else {
    pCVar1 = QArrayDataPointer<VkSpecParser::Command>::end
                       ((QArrayDataPointer<VkSpecParser::Command> *)in_stack_ffffffffffffffc0);
    for (; local_20 != pCVar1; local_20 = local_20 + 1) {
      VkSpecParser::Command::operator=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    }
  }
  *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) - in_RDX;
  std::destroy<VkSpecParser::Command*>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;
        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else {
            const T *const end = this->end();

            // move (by assignment) the elements from e to end
            // onto b to the new end
            while (e != end) {
                *b = std::move(*e);
                ++b;
                ++e;
            }
        }
        this->size -= n;
        std::destroy(b, e);
    }